

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O1

_Bool xor8_populate_gen(uint64_t *keys,uint32_t size,void *filter)

{
  ulong *puVar1;
  uint uVar2;
  undefined4 uVar3;
  ulong uVar4;
  size_t __size;
  long lVar5;
  void *__s;
  void *__ptr;
  void *__ptr_00;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  undefined4 *puVar20;
  byte bVar21;
  uint32_t r0;
  ulong local_b0;
  ulong local_88;
  
  if (size == 0) {
    return false;
  }
  local_b0 = (ulong)size;
  *(undefined8 *)filter = 0x910a2dec89025cc1;
  uVar4 = *(ulong *)((long)filter + 8);
  lVar5 = uVar4 * 0x10;
  __size = uVar4 * 0x30;
  __s = malloc(__size);
  __ptr = malloc(__size);
  __ptr_00 = malloc(local_b0 << 4);
  iVar15 = 0;
  if (__ptr_00 != (void *)0x0 && (__ptr != (void *)0x0 && __s != (void *)0x0)) {
    lVar6 = uVar4 * 0x20;
    local_88 = 0x9e3779b97f4a7c16;
    while( true ) {
      if (iVar15 + 1 == 10) {
        local_b0 = xor_sort_and_remove_dup(keys,local_b0 & 0xffffffff);
      }
      if (iVar15 == 100) {
        iVar15 = 0;
        goto LAB_00101a8d;
      }
      memset(__s,0,__size);
      uVar7 = local_b0 & 0xffffffff;
      if ((int)local_b0 != 0) {
        lVar8 = *filter;
        uVar9 = (ulong)*(uint *)((long)filter + 8);
        uVar13 = 0;
        do {
          uVar16 = (keys[uVar13] + lVar8 >> 0x21 ^ keys[uVar13] + lVar8) * -0xae502812aa7333;
          uVar16 = (uVar16 >> 0x21 ^ uVar16) * -0x3b314601e57a13ad;
          uVar17 = uVar16 >> 0x21 ^ uVar16;
          uVar19 = (uVar17 & 0xffffffff) * uVar9 >> 0x1c & 0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar19);
          *puVar1 = *puVar1 ^ uVar17;
          piVar10 = (int *)((long)__s + uVar19 + 8);
          *piVar10 = *piVar10 + 1;
          uVar16 = ((uint)(uVar17 << 0x15) | (uint)(uVar16 >> 0x2b)) * uVar9 >> 0x1c &
                   0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar16 + lVar5);
          *puVar1 = *puVar1 ^ uVar17;
          piVar10 = (int *)((long)__s + uVar16 + lVar5 + 8);
          *piVar10 = *piVar10 + 1;
          uVar16 = (uVar17 >> 0x16 & 0xffffffff) * uVar9 >> 0x1c & 0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar16 + lVar6);
          *puVar1 = *puVar1 ^ uVar17;
          piVar10 = (int *)((long)__s + uVar16 + lVar6 + 8);
          *piVar10 = *piVar10 + 1;
          uVar13 = uVar13 + 1;
        } while (uVar7 != uVar13);
      }
      uVar9 = *(ulong *)((long)filter + 8);
      if (uVar9 == 0) {
        lVar8 = 0;
      }
      else {
        lVar8 = 0;
        uVar13 = 0;
        piVar10 = (int *)((long)__s + 8);
        do {
          if (*piVar10 == 1) {
            *(int *)((long)__ptr + lVar8 * 0x10 + 8) = (int)uVar13;
            *(undefined8 *)((long)__ptr + lVar8 * 0x10) = *(undefined8 *)(piVar10 + -2);
            lVar8 = lVar8 + 1;
          }
          uVar13 = uVar13 + 1;
          piVar10 = piVar10 + 4;
        } while (uVar9 != uVar13);
      }
      if (uVar9 == 0) {
        lVar11 = 0;
      }
      else {
        lVar11 = 0;
        uVar13 = 0;
        piVar10 = (int *)((long)__s + lVar5 + 8);
        do {
          if (*piVar10 == 1) {
            *(int *)((long)__ptr + lVar11 * 0x10 + lVar5 + 8) = (int)uVar13;
            *(undefined8 *)((long)__ptr + lVar11 * 0x10 + lVar5) = *(undefined8 *)(piVar10 + -2);
            lVar11 = lVar11 + 1;
          }
          uVar13 = uVar13 + 1;
          piVar10 = piVar10 + 4;
        } while (uVar9 != uVar13);
      }
      if (uVar9 == 0) {
        lVar14 = 0;
      }
      else {
        lVar14 = 0;
        uVar13 = 0;
        piVar10 = (int *)((long)__s + lVar6 + 8);
        do {
          if (*piVar10 == 1) {
            *(int *)((long)__ptr + lVar14 * 0x10 + lVar6 + 8) = (int)uVar13;
            *(undefined8 *)((long)__ptr + lVar14 * 0x10 + lVar6) = *(undefined8 *)(piVar10 + -2);
            lVar14 = lVar14 + 1;
          }
          uVar13 = uVar13 + 1;
          piVar10 = piVar10 + 4;
        } while (uVar9 != uVar13);
      }
      if (lVar11 + lVar8 + lVar14 == 0) {
        uVar13 = 0;
      }
      else {
        uVar9 = uVar9 & 0xffffffff;
        uVar13 = 0;
        do {
          if (lVar8 != 0) {
            puVar20 = (undefined4 *)((long)__ptr + lVar8 * 0x10 + -4);
            do {
              uVar2 = puVar20[-1];
              if (*(int *)((long)__s + (ulong)uVar2 * 0x10 + 8) != 0) {
                uVar16 = *(ulong *)(puVar20 + -3);
                uVar3 = *puVar20;
                uVar19 = ((uint)(uVar16 << 0x15) | (uint)(uVar16 >> 0x2b)) * uVar9;
                lVar18 = uVar13 * 0x10;
                *(ulong *)((long)__ptr_00 + lVar18) = uVar16;
                *(uint *)((long)__ptr_00 + lVar18 + 8) = uVar2;
                *(undefined4 *)((long)__ptr_00 + lVar18 + 0xc) = uVar3;
                lVar18 = (uVar19 >> 0x20) * 0x10;
                uVar17 = *(ulong *)((long)__s + lVar18 + lVar5) ^ uVar16;
                *(ulong *)((long)__s + lVar18 + lVar5) = uVar17;
                iVar12 = *(int *)((long)__s + lVar18 + lVar5 + 8) + -1;
                *(int *)((long)__s + lVar18 + lVar5 + 8) = iVar12;
                if (iVar12 == 1) {
                  *(int *)((long)__ptr + lVar11 * 0x10 + lVar5 + 8) = (int)(uVar19 >> 0x20);
                  *(ulong *)((long)__ptr + lVar11 * 0x10 + lVar5) = uVar17;
                  lVar11 = lVar11 + 1;
                }
                uVar17 = (uVar16 >> 0x16 & 0xffffffff) * uVar9;
                uVar13 = uVar13 + 1;
                lVar18 = (uVar17 >> 0x20) * 0x10;
                uVar16 = uVar16 ^ *(ulong *)((long)__s + lVar18 + lVar6);
                *(ulong *)((long)__s + lVar18 + lVar6) = uVar16;
                iVar12 = *(int *)((long)__s + lVar18 + lVar6 + 8) + -1;
                *(int *)((long)__s + lVar18 + lVar6 + 8) = iVar12;
                if (iVar12 == 1) {
                  *(int *)((long)__ptr + lVar14 * 0x10 + lVar6 + 8) = (int)(uVar17 >> 0x20);
                  *(ulong *)((long)__ptr + lVar14 * 0x10 + lVar6) = uVar16;
                  lVar14 = lVar14 + 1;
                }
              }
              lVar8 = lVar8 + -1;
              puVar20 = puVar20 + -4;
            } while (lVar8 != 0);
          }
          if (lVar11 == 0) {
            lVar8 = 0;
          }
          else {
            puVar20 = (undefined4 *)((long)__ptr + lVar11 * 0x10 + lVar5 + -4);
            lVar8 = 0;
            do {
              uVar2 = puVar20[-1];
              if (*(int *)((long)__s + (ulong)uVar2 * 0x10 + lVar5 + 8) != 0) {
                uVar16 = *(ulong *)(puVar20 + -3);
                uVar3 = *puVar20;
                uVar19 = (uVar16 & 0xffffffff) * uVar9;
                lVar18 = uVar13 * 0x10;
                *(ulong *)((long)__ptr_00 + lVar18) = uVar16;
                *(uint *)((long)__ptr_00 + lVar18 + 8) = uVar2 + (int)uVar4;
                *(undefined4 *)((long)__ptr_00 + lVar18 + 0xc) = uVar3;
                lVar18 = (uVar19 >> 0x20) * 0x10;
                uVar17 = *(ulong *)((long)__s + lVar18) ^ uVar16;
                *(ulong *)((long)__s + lVar18) = uVar17;
                iVar12 = *(int *)((long)__s + lVar18 + 8) + -1;
                *(int *)((long)__s + lVar18 + 8) = iVar12;
                if (iVar12 == 1) {
                  *(int *)((long)__ptr + lVar8 * 0x10 + 8) = (int)(uVar19 >> 0x20);
                  *(ulong *)((long)__ptr + lVar8 * 0x10) = uVar17;
                  lVar8 = lVar8 + 1;
                }
                uVar17 = (uVar16 >> 0x16 & 0xffffffff) * uVar9;
                uVar13 = uVar13 + 1;
                lVar18 = (uVar17 >> 0x20) * 0x10;
                uVar16 = uVar16 ^ *(ulong *)((long)__s + lVar18 + lVar6);
                *(ulong *)((long)__s + lVar18 + lVar6) = uVar16;
                iVar12 = *(int *)((long)__s + lVar18 + lVar6 + 8) + -1;
                *(int *)((long)__s + lVar18 + lVar6 + 8) = iVar12;
                if (iVar12 == 1) {
                  *(int *)((long)__ptr + lVar14 * 0x10 + lVar6 + 8) = (int)(uVar17 >> 0x20);
                  *(ulong *)((long)__ptr + lVar14 * 0x10 + lVar6) = uVar16;
                  lVar14 = lVar14 + 1;
                }
              }
              lVar11 = lVar11 + -1;
              puVar20 = puVar20 + -4;
            } while (lVar11 != 0);
          }
          if (lVar14 == 0) {
            lVar11 = 0;
          }
          else {
            puVar20 = (undefined4 *)((long)__ptr + lVar14 * 0x10 + lVar6 + -4);
            lVar11 = 0;
            do {
              uVar2 = puVar20[-1];
              if (*(int *)((long)__s + (ulong)uVar2 * 0x10 + lVar6 + 8) != 0) {
                uVar16 = *(ulong *)(puVar20 + -3);
                uVar3 = *puVar20;
                uVar19 = (uVar16 & 0xffffffff) * uVar9;
                lVar18 = uVar13 * 0x10;
                *(ulong *)((long)__ptr_00 + lVar18) = uVar16;
                *(uint *)((long)__ptr_00 + lVar18 + 8) = uVar2 + (int)uVar4 * 2;
                *(undefined4 *)((long)__ptr_00 + lVar18 + 0xc) = uVar3;
                lVar18 = (uVar19 >> 0x20) * 0x10;
                uVar17 = *(ulong *)((long)__s + lVar18) ^ uVar16;
                *(ulong *)((long)__s + lVar18) = uVar17;
                iVar12 = *(int *)((long)__s + lVar18 + 8) + -1;
                *(int *)((long)__s + lVar18 + 8) = iVar12;
                if (iVar12 == 1) {
                  *(int *)((long)__ptr + lVar8 * 0x10 + 8) = (int)(uVar19 >> 0x20);
                  *(ulong *)((long)__ptr + lVar8 * 0x10) = uVar17;
                  lVar8 = lVar8 + 1;
                }
                uVar17 = ((uint)(uVar16 << 0x15) | (uint)(uVar16 >> 0x2b)) * uVar9;
                uVar13 = uVar13 + 1;
                lVar18 = (uVar17 >> 0x20) * 0x10;
                uVar16 = uVar16 ^ *(ulong *)((long)__s + lVar18 + lVar5);
                *(ulong *)((long)__s + lVar18 + lVar5) = uVar16;
                iVar12 = *(int *)((long)__s + lVar18 + lVar5 + 8) + -1;
                *(int *)((long)__s + lVar18 + lVar5 + 8) = iVar12;
                if (iVar12 == 1) {
                  *(int *)((long)__ptr + lVar11 * 0x10 + lVar5 + 8) = (int)(uVar17 >> 0x20);
                  *(ulong *)((long)__ptr + lVar11 * 0x10 + lVar5) = uVar16;
                  lVar11 = lVar11 + 1;
                }
              }
              lVar14 = lVar14 + -1;
              puVar20 = puVar20 + -4;
            } while (lVar14 != 0);
          }
          lVar14 = 0;
        } while (lVar8 + lVar11 != 0);
      }
      if (uVar13 == uVar7) break;
      local_88 = local_88 + 0x9e3779b97f4a7c15;
      uVar7 = (local_88 >> 0x1e ^ local_88) * -0x40a7b892e31b1a47;
      uVar7 = (uVar7 >> 0x1b ^ uVar7) * -0x6b2fb644ecceee15;
      *(ulong *)filter = uVar7 >> 0x1f ^ uVar7;
      iVar15 = iVar15 + 1;
    }
    iVar15 = 1;
    if ((int)local_b0 != 0) {
      lVar5 = *(long *)((long)filter + 0x10);
      lVar6 = uVar7 << 4;
      do {
        uVar7 = *(ulong *)((long)__ptr_00 + lVar6 + -0x10);
        uVar9 = (ulong)*(uint *)((long)__ptr_00 + lVar6 + -8);
        uVar13 = (ulong)*(uint *)((long)filter + 8);
        if (uVar9 < uVar4) {
          bVar21 = *(byte *)(lVar5 + uVar4 +
                            (((uint)(uVar7 << 0x15) | (uint)(uVar7 >> 0x2b)) * uVar13 >> 0x20));
LAB_00101a37:
          uVar16 = uVar7 >> 0x16;
          lVar8 = lVar5 + uVar4 * 2;
        }
        else {
          bVar21 = *(byte *)(lVar5 + ((uVar7 & 0xffffffff) * uVar13 >> 0x20));
          if (uVar9 < uVar4 * 2) goto LAB_00101a37;
          uVar16 = uVar7 << 0x15 | uVar7 >> 0x2b;
          lVar8 = lVar5 + uVar4;
        }
        *(byte *)(*(long *)((long)filter + 0x10) + uVar9) =
             (byte)(uVar7 >> 0x20) ^ (byte)uVar7 ^
             bVar21 ^ *(byte *)(lVar8 + (uVar13 * (uVar16 & 0xffffffff) >> 0x20));
        lVar6 = lVar6 + -0x10;
      } while (lVar6 != 0);
      iVar15 = 1;
    }
  }
LAB_00101a8d:
  free(__s);
  free(__ptr);
  free(__ptr_00);
  return SUB41(iVar15,0);
}

Assistant:

static inline bool xor8_populate(uint64_t *keys, uint32_t size, xor8_t *filter) {
  if(size == 0) { return false; }
  uint64_t rng_counter = 1;
  filter->seed = xor_rng_splitmix64(&rng_counter);
  size_t arrayLength = (size_t)(filter->blockLength) * 3; // size of the backing array
  size_t blockLength = (size_t)(filter->blockLength);

  xor_xorset_t *sets =
      (xor_xorset_t *)malloc(arrayLength * sizeof(xor_xorset_t));

  xor_keyindex_t *Q =
      (xor_keyindex_t *)malloc(arrayLength * sizeof(xor_keyindex_t));

  xor_keyindex_t *stack =
      (xor_keyindex_t *)malloc(size * sizeof(xor_keyindex_t));

  if ((sets == NULL) || (Q == NULL) || (stack == NULL)) {
    free(sets);
    free(Q);
    free(stack);
    return false;
  }
  xor_xorset_t *sets0 = sets;
  xor_xorset_t *sets1 = sets + blockLength;
  xor_xorset_t *sets2 = sets + 2 * blockLength;
  xor_keyindex_t *Q0 = Q;
  xor_keyindex_t *Q1 = Q + blockLength;
  xor_keyindex_t *Q2 = Q + 2 * blockLength;

  int iterations = 0;

  while (true) {
    iterations ++;
    if(iterations == XOR_SORT_ITERATIONS) {
      size = (uint32_t)xor_sort_and_remove_dup(keys, size);
    }
    if(iterations > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system).
      free(sets);
      free(Q);
      free(stack);
      return false;
    }

    memset(sets, 0, sizeof(xor_xorset_t) * arrayLength);
    for (size_t i = 0; i < size; i++) {
      uint64_t key = keys[i];
      xor_hashes_t hs = xor8_get_h0_h1_h2(key, filter);
      sets0[hs.h0].xormask ^= hs.h;
      sets0[hs.h0].count++;
      sets1[hs.h1].xormask ^= hs.h;
      sets1[hs.h1].count++;
      sets2[hs.h2].xormask ^= hs.h;
      sets2[hs.h2].count++;
    }
    // todo: the flush should be sync with the detection that follows
    // scan for values with a count of one
    size_t Q0size = 0, Q1size = 0, Q2size = 0;
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets0[i].count == 1) {
        Q0[Q0size].index = (uint32_t)i;
        Q0[Q0size].hash = sets0[i].xormask;
        Q0size++;
      }
    }

    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets1[i].count == 1) {
        Q1[Q1size].index = (uint32_t)i;
        Q1[Q1size].hash = sets1[i].xormask;
        Q1size++;
      }
    }
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets2[i].count == 1) {
        Q2[Q2size].index = (uint32_t)i;
        Q2[Q2size].hash = sets2[i].xormask;
        Q2size++;
      }
    }

    size_t stack_size = 0;
    while (Q0size + Q1size + Q2size > 0) {
      while (Q0size > 0) {
        xor_keyindex_t keyindex = Q0[--Q0size];
        size_t index = keyindex.index;
        if (sets0[index].count == 0)
          continue; // not actually possible after the initial scan.
        //sets0[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h1 = xor8_get_h1(hash, filter);
        uint32_t h2 = xor8_get_h2(hash, filter);

        stack[stack_size] = keyindex;
        stack_size++;
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q1size > 0) {
        xor_keyindex_t keyindex = Q1[--Q1size];
        size_t index = keyindex.index;
        if (sets1[index].count == 0)
          continue;
        //sets1[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h0 = xor8_get_h0(hash, filter);
        uint32_t h2 = xor8_get_h2(hash, filter);
        keyindex.index += (uint32_t)blockLength;
        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q2size > 0) {
        xor_keyindex_t keyindex = Q2[--Q2size];
        size_t index = keyindex.index;
        if (sets2[index].count == 0)
          continue;

        //sets2[index].count = 0;
        uint64_t hash = keyindex.hash;

        uint32_t h0 = xor8_get_h0(hash, filter);
        uint32_t h1 = xor8_get_h1(hash, filter);
        keyindex.index += 2 * (uint32_t)blockLength;

        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }

      }
    }
    if (stack_size == size) {
      // success
      break;
    }

    filter->seed = xor_rng_splitmix64(&rng_counter);
  }
  uint8_t * fingerprints0 = filter->fingerprints;
  uint8_t * fingerprints1 = filter->fingerprints + blockLength;
  uint8_t * fingerprints2 = filter->fingerprints + 2 * blockLength;

  size_t stack_size = size;
  while (stack_size > 0) {
    xor_keyindex_t ki = stack[--stack_size];
    uint64_t val = xor_fingerprint(ki.hash);
    if(ki.index < blockLength) {
      val ^= (uint32_t)fingerprints1[xor8_get_h1(ki.hash,filter)] ^ fingerprints2[xor8_get_h2(ki.hash,filter)];
    } else if(ki.index < 2 * blockLength) {
      val ^= (uint32_t)fingerprints0[xor8_get_h0(ki.hash,filter)] ^ fingerprints2[xor8_get_h2(ki.hash,filter)];
    } else {
      val ^= (uint32_t)fingerprints0[xor8_get_h0(ki.hash,filter)] ^ fingerprints1[xor8_get_h1(ki.hash,filter)];
    }
    filter->fingerprints[ki.index] = (uint8_t)val;
  }

  free(sets);
  free(Q);
  free(stack);
  return true;
}